

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

void Cec2_ManSimClassRefineOne(Gia_Man_t *p,int iRepr)

{
  int iObj1;
  int iObj1_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  
  iVar3 = Gia_ObjIsHead(p,iRepr);
  if (iVar3 == 0) {
    __assert_fail("Gia_ObjIsHead(p, iRepr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                  ,0x251,"void Cec2_ManSimClassRefineOne(Gia_Man_t *, int)");
  }
  piVar6 = p->pNexts + iRepr;
  iVar3 = iRepr;
  while( true ) {
    iObj1 = *piVar6;
    lVar9 = (long)iObj1;
    if (lVar9 < 1) {
      return;
    }
    iVar4 = Cec2_ObjSimEqual(p,iRepr,iObj1);
    if (iVar4 == 0) break;
    piVar6 = p->pNexts + lVar9;
    iVar3 = iObj1;
  }
  p->pReprs[lVar9] = (Gia_Rpr_t)((uint)p->pReprs[lVar9] | 0xfffffff);
  piVar7 = p->pNexts;
  piVar6 = piVar7 + lVar9;
  iVar4 = iObj1;
  while( true ) {
    iObj1_00 = *piVar6;
    if ((long)iObj1_00 < 1) break;
    iVar5 = Cec2_ObjSimEqual(p,iRepr,iObj1_00);
    iVar1 = iVar4;
    iVar8 = iVar3;
    iVar2 = iObj1_00;
    if (iVar5 == 0) {
      Gia_ObjSetRepr(p,iObj1_00,iObj1);
      iVar1 = iObj1_00;
      iVar8 = iVar4;
      iVar2 = iVar3;
    }
    iVar3 = iVar2;
    iVar4 = iVar1;
    piVar7 = p->pNexts;
    piVar7[iVar8] = iObj1_00;
    piVar6 = piVar7 + iObj1_00;
  }
  piVar7[iVar3] = -1;
  piVar7[iVar4] = -1;
  return;
}

Assistant:

void Cec2_ManSimClassRefineOne( Gia_Man_t * p, int iRepr )
{
    int iObj, iPrev = iRepr, iPrev2, iRepr2;
    Gia_ClassForEachObj1( p, iRepr, iRepr2 )
        if ( Cec2_ObjSimEqual(p, iRepr, iRepr2) )
            iPrev = iRepr2;
        else
            break;
    if ( iRepr2 <= 0 ) // no refinement
        return;
    // relink remaining nodes of the class
    // nodes that are equal to iRepr, remain in the class of iRepr
    // nodes that are not equal to iRepr, move to the class of iRepr2
    Gia_ObjSetRepr( p, iRepr2, GIA_VOID );
    iPrev2 = iRepr2;
    for ( iObj = Gia_ObjNext(p, iRepr2); iObj > 0; iObj = Gia_ObjNext(p, iObj) )
    {
        if ( Cec2_ObjSimEqual(p, iRepr, iObj) ) // remains with iRepr
        {
            Gia_ObjSetNext( p, iPrev, iObj );
            iPrev = iObj;
        }
        else // moves to iRepr2
        {
            Gia_ObjSetRepr( p, iObj, iRepr2 );
            Gia_ObjSetNext( p, iPrev2, iObj );
            iPrev2 = iObj;
        }
    }
    Gia_ObjSetNext( p, iPrev, -1 );
    Gia_ObjSetNext( p, iPrev2, -1 );
}